

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  stbrp_node **ppsVar6;
  stbrp_context *psVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  int *piVar11;
  int iVar12;
  undefined4 in_register_00000014;
  ulong uVar13;
  long lVar14;
  stbrp_context *psVar15;
  stbrp_node **ppsVar16;
  stbrp_node *psVar17;
  stbrp_node *psVar18;
  stbrp_node **in_R8;
  stbrp_node *psVar19;
  int iVar20;
  uint uVar21;
  stbrp_context *c;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int waste;
  int local_a8;
  uint local_a4;
  stbrp_node **local_a0;
  int local_90;
  int local_8c;
  stbrp_context *local_88;
  ulong local_80;
  undefined8 local_78;
  stbrp_node **local_70;
  stbrp_node *local_68;
  ulong local_60;
  stbrp_rect *local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  auVar5 = _DAT_0015c090;
  local_78 = CONCAT44(in_register_00000014,num_rects);
  uVar23 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    lVar14 = uVar23 - 1;
    auVar25._8_4_ = (int)lVar14;
    auVar25._0_8_ = lVar14;
    auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
    piVar11 = &rects[1].was_packed;
    uVar13 = 0;
    auVar25 = auVar25 ^ _DAT_0015c090;
    auVar26 = _DAT_0015c0b0;
    do {
      auVar27 = auVar26 ^ auVar5;
      if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                  auVar25._4_4_ < auVar27._4_4_) & 1)) {
        piVar11[-4] = (int)uVar13;
      }
      if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
          auVar27._12_4_ <= auVar25._12_4_) {
        *piVar11 = (int)uVar13 + 1;
      }
      uVar13 = uVar13 + 2;
      lVar14 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar14 + 2;
      piVar11 = piVar11 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar13);
  }
  local_48 = (size_t)num_rects;
  qsort(rects,local_48,0x10,rect_height_compare);
  if (0 < num_rects) {
    ppsVar16 = &context->active_head;
    uVar13 = 0;
    local_88 = context;
    local_70 = ppsVar16;
    local_40 = uVar23;
    local_38 = rects;
    do {
      psVar1 = rects + uVar13;
      uVar2 = rects[uVar13].w;
      uVar9 = (ulong)uVar2;
      if (uVar2 == 0) {
LAB_0010de15:
        psVar1->x = 0;
        psVar1->y = 0;
        local_a0 = in_R8;
      }
      else {
        uVar3 = psVar1->h;
        local_80 = (ulong)uVar3;
        if (uVar3 == 0) goto LAB_0010de15;
        iVar12 = context->width;
        iVar20 = (uint)uVar2 + context->align + -1;
        iVar20 = iVar20 - iVar20 % context->align;
        local_60 = uVar9;
        local_58 = psVar1;
        local_50 = uVar13;
        if (iVar12 < iVar20) {
LAB_0010de0b:
          local_a0 = (stbrp_node **)0x0;
          uVar10 = 0;
        }
        else {
          iVar4 = context->height;
          local_80._0_4_ = (uint)uVar3;
          if (iVar4 < (int)(uint)local_80) goto LAB_0010de0b;
          c = (stbrp_context *)*ppsVar16;
          uVar2 = (ushort)c->width;
          psVar17 = (stbrp_node *)(ulong)uVar2;
          local_68 = psVar17;
          if (iVar12 < (int)(iVar20 + (uint)uVar2)) {
            local_a8 = 0x40000000;
            iVar22 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
          }
          else {
            iVar22 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
            local_a8 = 0x40000000;
            psVar15 = c;
            do {
              iVar8 = stbrp__skyline_find_min_y(psVar15,psVar17,iVar20,(int)&local_8c,(int *)in_R8);
              if (local_88->heuristic == 0) {
                if (iVar8 < iVar22) {
                  local_a0 = ppsVar16;
                  iVar22 = iVar8;
                }
              }
              else if (((int)local_80 + iVar8 <= iVar4) &&
                      ((iVar8 < iVar22 || ((iVar8 == iVar22 && (local_8c < local_a8)))))) {
                local_a8 = local_8c;
                local_a0 = ppsVar16;
                iVar22 = iVar8;
              }
              ppsVar16 = (stbrp_node **)&psVar15->align;
              uVar2 = (ushort)(*(stbrp_context **)&psVar15->align)->width;
              psVar17 = (stbrp_node *)(ulong)uVar2;
              psVar15 = *(stbrp_context **)&psVar15->align;
            } while ((int)(iVar20 + (uint)uVar2) <= iVar12);
          }
          if (local_a0 == (stbrp_node **)0x0) {
            local_a4 = 0;
          }
          else {
            local_a4 = (uint)(*local_a0)->x;
          }
          if (local_88->heuristic == 1) {
            uVar21 = (uint)local_68;
            psVar15 = c;
            while (ppsVar16 = local_70, (int)uVar21 < iVar20) {
              psVar15 = *(stbrp_context **)&psVar15->align;
              uVar21 = (uint)(ushort)psVar15->width;
            }
            do {
              uVar21 = (uint)(ushort)psVar15->width - iVar20;
              ppsVar6 = ppsVar16;
              psVar7 = c;
              do {
                c = psVar7;
                ppsVar16 = ppsVar6;
                ppsVar6 = (stbrp_node **)&c->align;
                psVar7 = *(stbrp_context **)&c->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar21);
              iVar12 = stbrp__skyline_find_min_y
                                 (c,(stbrp_node *)(ulong)uVar21,iVar20,(int)&local_90,(int *)in_R8);
              if ((((int)local_80 + iVar12 <= iVar4) && (iVar12 <= iVar22)) &&
                 (((iVar12 < iVar22 || (local_90 < local_a8)) ||
                  ((local_90 == local_a8 && ((int)uVar21 < (int)local_a4)))))) {
                local_a8 = local_90;
                local_a4 = uVar21;
                local_a0 = ppsVar16;
                iVar22 = iVar12;
              }
              psVar15 = *(stbrp_context **)&psVar15->align;
            } while (psVar15 != (stbrp_context *)0x0);
          }
          uVar10 = CONCAT44(iVar22,local_a4);
          ppsVar16 = local_70;
          context = local_88;
          rects = local_38;
          uVar23 = local_40;
        }
        uVar13 = local_50;
        if (((local_a0 == (stbrp_node **)0x0) ||
            (iVar12 = (int)local_80 + (int)((ulong)uVar10 >> 0x20), context->height < iVar12)) ||
           (psVar17 = context->free_head, psVar17 == (stbrp_node *)0x0)) {
          local_58->x = 0xffff;
          local_58->y = 0xffff;
        }
        else {
          psVar17->x = (stbrp_coord)uVar10;
          psVar17->y = (stbrp_coord)iVar12;
          context->free_head = psVar17->next;
          psVar19 = *local_a0;
          iVar12 = (int)uVar10;
          psVar18 = psVar19;
          if ((int)(uint)psVar19->x < iVar12) {
            psVar18 = psVar19->next;
            local_a0 = &psVar19->next;
          }
          *local_a0 = psVar17;
          if (psVar18->next != (stbrp_node *)0x0) {
            local_a0 = &psVar18->next;
            psVar19 = psVar18->next;
            do {
              if (iVar12 + (int)local_60 < (int)(uint)psVar19->x) break;
              *local_a0 = context->free_head;
              context->free_head = psVar18;
              local_a0 = &psVar19->next;
              ppsVar6 = &psVar19->next;
              psVar18 = psVar19;
              psVar19 = *ppsVar6;
            } while (*ppsVar6 != (stbrp_node *)0x0);
          }
          psVar17->next = psVar18;
          iVar12 = (int)local_60 + iVar12;
          if ((int)(uint)psVar18->x < iVar12) {
            psVar18->x = (stbrp_coord)iVar12;
          }
          local_58->x = (stbrp_coord)uVar10;
          local_58->y = (stbrp_coord)((ulong)uVar10 >> 0x20);
        }
      }
      uVar13 = uVar13 + 1;
      in_R8 = local_a0;
    } while (uVar13 != uVar23);
  }
  qsort(rects,local_48,0x10,rect_original_order);
  if ((int)local_78 < 1) {
    iVar12 = 1;
  }
  else {
    iVar12 = 1;
    lVar14 = 0;
    do {
      bVar24 = true;
      if (*(short *)((long)&rects->x + lVar14) == -1) {
        bVar24 = *(short *)((long)&rects->y + lVar14) != -1;
      }
      *(uint *)((long)&rects->was_packed + lVar14) = (uint)bVar24;
      if (bVar24 == false) {
        iVar12 = 0;
      }
      lVar14 = lVar14 + 0x10;
    } while (uVar23 * 0x10 != lVar14);
  }
  return iVar12;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
int i, all_rects_packed = 1;

/*  we use the 'was_packed' field internally to allow sorting/unsorting */
for (i=0; i < num_rects; ++i) {
rects[i].was_packed = i;
}

/*  sort according to heuristic */
STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

for (i=0; i < num_rects; ++i) {
if (rects[i].w == 0 || rects[i].h == 0) {
rects[i].x = rects[i].y = 0;  /*  empty rect needs no space */
} else {
stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
if (fr.prev_link) {
rects[i].x = (stbrp_coord) fr.x;
rects[i].y = (stbrp_coord) fr.y;
} else {
rects[i].x = rects[i].y = STBRP__MAXVAL;
}
}
}

/*  unsort */
STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

/*  set was_packed flags and all_rects_packed status */
for (i=0; i < num_rects; ++i) {
rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
if (!rects[i].was_packed)
all_rects_packed = 0;
}

/*  return the all_rects_packed status */
return all_rects_packed;
}